

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::SpecifyBlockSyntax::SpecifyBlockSyntax
          (SpecifyBlockSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token specify,SyntaxList<slang::syntax::MemberSyntax> *items,Token endspecify)

{
  pointer ppMVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = specify._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,SpecifyBlock,attributes);
  (this->specify).kind = (short)uVar5;
  (this->specify).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->specify).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->specify).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->specify).info = specify.info;
  SVar3 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473020;
  (this->endspecify).kind = endspecify.kind;
  (this->endspecify).field_0x2 = endspecify._2_1_;
  (this->endspecify).numFlags = (NumericTokenFlags)endspecify.numFlags.raw;
  (this->endspecify).rawLen = endspecify.rawLen;
  (this->endspecify).info = endspecify.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    **(undefined8 **)((long)ppMVar1 + lVar6) = this;
  }
  return;
}

Assistant:

SpecifyBlockSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token specify, const SyntaxList<MemberSyntax>& items, Token endspecify) :
        MemberSyntax(SyntaxKind::SpecifyBlock, attributes), specify(specify), items(items), endspecify(endspecify) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }